

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnSimdLaneOpExpr
          (BinaryReaderIR *this,Opcode opcode,uint64_t value)

{
  unique_ptr<wabt::SimdLaneOpExpr,_std::default_delete<wabt::SimdLaneOpExpr>_> local_30;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_28;
  uint64_t local_20;
  uint64_t value_local;
  BinaryReaderIR *this_local;
  Opcode opcode_local;
  
  local_20 = value;
  value_local = (uint64_t)this;
  this_local._0_4_ = opcode.enum_;
  MakeUnique<wabt::SimdLaneOpExpr,wabt::Opcode&,unsigned_long&>
            ((wabt *)&local_30,(Opcode *)&this_local,&local_20);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::SimdLaneOpExpr,std::default_delete<wabt::SimdLaneOpExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_28,&local_30);
  this_local._4_4_ = AppendExpr(this,&local_28);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_28);
  std::unique_ptr<wabt::SimdLaneOpExpr,_std::default_delete<wabt::SimdLaneOpExpr>_>::~unique_ptr
            (&local_30);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnSimdLaneOpExpr(Opcode opcode, uint64_t value) {
  return AppendExpr(MakeUnique<SimdLaneOpExpr>(opcode, value));
}